

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLex.cpp
# Opt level: O0

void __thiscall UnitTest_lex5::UnitTest_lex5(UnitTest_lex5 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_00268708;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"lex5");
  return;
}

Assistant:

TEST_CASE(lex5)
{
    LexerWrapper lexer("+ - * / % ^ # == ~= <= >= < > = ( ) { } [ ] ; : , . .. ...");
    EXPECT_TRUE(lexer.GetToken() == '+');
    EXPECT_TRUE(lexer.GetToken() == '-');
    EXPECT_TRUE(lexer.GetToken() == '*');
    EXPECT_TRUE(lexer.GetToken() == '/');
    EXPECT_TRUE(lexer.GetToken() == '%');
    EXPECT_TRUE(lexer.GetToken() == '^');
    EXPECT_TRUE(lexer.GetToken() == '#');
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Equal);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_NotEqual);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_LessEqual);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_GreaterEqual);
    EXPECT_TRUE(lexer.GetToken() == '<');
    EXPECT_TRUE(lexer.GetToken() == '>');
    EXPECT_TRUE(lexer.GetToken() == '=');
    EXPECT_TRUE(lexer.GetToken() == '(');
    EXPECT_TRUE(lexer.GetToken() == ')');
    EXPECT_TRUE(lexer.GetToken() == '{');
    EXPECT_TRUE(lexer.GetToken() == '}');
    EXPECT_TRUE(lexer.GetToken() == '[');
    EXPECT_TRUE(lexer.GetToken() == ']');
    EXPECT_TRUE(lexer.GetToken() == ';');
    EXPECT_TRUE(lexer.GetToken() == ':');
    EXPECT_TRUE(lexer.GetToken() == ',');
    EXPECT_TRUE(lexer.GetToken() == '.');
    EXPECT_TRUE(lexer.GetToken() == luna::Token_Concat);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_VarArg);
    EXPECT_TRUE(lexer.GetToken() == luna::Token_EOF);
}